

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O2

void __thiscall Application::Run(Application *this)

{
  int iVar1;
  double dVar2;
  double dVar3;
  
  dVar2 = glfwGetTime();
  while( true ) {
    iVar1 = glfwWindowShouldClose(this->m_window);
    if (iVar1 != 0) break;
    dVar3 = glfwGetTime();
    glfwPollEvents();
    if (this->m_ui_state == kOctreeTracer) {
      Camera::Control((this->m_camera).super___shared_ptr<Camera,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      ,this->m_window,(float)(dVar3 - dVar2));
    }
    ui_switch_state(this);
    ImGui_ImplGlfw_NewFrame();
    ImGui::NewFrame();
    if (this->m_ui_display_flag == true) {
      ui_render_main(this);
    }
    ImGui::Render();
    draw_frame(this);
    dVar2 = dVar3;
  }
  return;
}

Assistant:

void Application::Run() {
	double lst_time = glfwGetTime();
	while (!glfwWindowShouldClose(m_window)) {
		double cur_time = glfwGetTime();

		glfwPollEvents();

		if (m_ui_state == UIStates::kOctreeTracer)
			m_camera->Control(m_window, float(cur_time - lst_time));

		ui_switch_state();

		ImGui_ImplGlfw_NewFrame();
		ImGui::NewFrame();
		if (m_ui_display_flag)
			ui_render_main();
		ImGui::Render();

		draw_frame();
		lst_time = cur_time;
	}
}